

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

void __thiscall rlottie::internal::model::Repeater::Transform::~Transform(Transform *this)

{
  Property<VPointF,_void> *in_RDI;
  
  Property<float,_void>::~Property((Property<float,_void> *)in_RDI);
  Property<float,_void>::~Property((Property<float,_void> *)in_RDI);
  Property<VPointF,_void>::~Property(in_RDI);
  Property<VPointF,_void>::~Property(in_RDI);
  Property<VPointF,_void>::~Property(in_RDI);
  Property<float,_void>::~Property((Property<float,_void> *)in_RDI);
  return;
}

Assistant:

float   startOpacity(int frameNo) const
        {
            return mStartOpacity.value(frameNo) / 100;
        }